

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O0

int mg_raw_transport_init(int sockfd,mg_raw_transport **transport,mg_allocator *allocator)

{
  undefined8 *puVar1;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  undefined4 in_EDI;
  mg_raw_transport *ttransport;
  size_t in_stack_ffffffffffffffd8;
  mg_allocator *in_stack_ffffffffffffffe0;
  int local_4;
  
  puVar1 = (undefined8 *)mg_allocator_malloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (puVar1 == (undefined8 *)0x0) {
    local_4 = -3;
  }
  else {
    *(undefined4 *)(puVar1 + 5) = in_EDI;
    *puVar1 = mg_raw_transport_send;
    puVar1[1] = mg_raw_transport_recv;
    puVar1[2] = mg_raw_transport_destroy;
    puVar1[3] = mg_raw_transport_suspend_until_ready_to_read;
    puVar1[4] = mg_raw_transport_suspend_until_ready_to_write;
    puVar1[6] = in_RDX;
    *in_RSI = puVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mg_raw_transport_init(int sockfd, mg_raw_transport **transport,
                          mg_allocator *allocator) {
  mg_raw_transport *ttransport =
      mg_allocator_malloc(allocator, sizeof(mg_raw_transport));
  if (!ttransport) {
    return MG_ERROR_OOM;
  }
  ttransport->sockfd = sockfd;
  ttransport->send = mg_raw_transport_send;
  ttransport->recv = mg_raw_transport_recv;
  ttransport->destroy = mg_raw_transport_destroy;
  ttransport->suspend_until_ready_to_read =
      mg_raw_transport_suspend_until_ready_to_read;
  ttransport->suspend_until_ready_to_write =
      mg_raw_transport_suspend_until_ready_to_write;
  ttransport->allocator = allocator;
  *transport = ttransport;
  return 0;
}